

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O1

void reorder_invent(void)

{
  obj *poVar1;
  bool bVar2;
  obj *poVar3;
  obj *poVar4;
  obj **ppoVar5;
  
  if (invent != (obj *)0x0) {
    bVar2 = false;
    ppoVar5 = (obj **)0x0;
    poVar3 = invent;
    do {
      do {
        poVar1 = poVar3->nobj;
        poVar4 = poVar1;
        if ((poVar1 != (obj *)0x0) &&
           ((char)(poVar1->invlet ^ 0x20U) < (char)(poVar3->invlet ^ 0x20U))) {
          if ((obj *)ppoVar5 == (obj *)0x0) {
            ppoVar5 = &invent;
          }
          ((obj *)ppoVar5)->nobj = poVar1;
          poVar3->nobj = poVar1->nobj;
          poVar1->nobj = poVar3;
          bVar2 = true;
          poVar4 = poVar3;
          poVar3 = poVar1;
        }
        ppoVar5 = &poVar3->nobj;
        poVar3 = poVar4;
      } while (poVar4 != (obj *)0x0);
      if (!bVar2) {
        return;
      }
      bVar2 = false;
      ppoVar5 = (obj **)0x0;
      poVar3 = invent;
    } while (invent != (obj *)0x0);
  }
  return;
}

Assistant:

static void reorder_invent(void)
{
	struct obj *otmp, *prev, *next;
	boolean need_more_sorting;

	do {
	    /*
	     * We expect at most one item to be out of order, so this
	     * isn't nearly as inefficient as it may first appear.
	     */
	    need_more_sorting = FALSE;
	    for (otmp = invent, prev = 0; otmp; ) {
		next = otmp->nobj;
		if (next && inv_rank(next) < inv_rank(otmp)) {
		    need_more_sorting = TRUE;
		    if (prev) prev->nobj = next;
		    else      invent = next;
		    otmp->nobj = next->nobj;
		    next->nobj = otmp;
		    prev = next;
		} else {
		    prev = otmp;
		    otmp = next;
		}
	    }
	} while (need_more_sorting);
}